

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

int __thiscall Parse::selectionStmt(Parse *this)

{
  int iVar1;
  KeyWordTable *pKVar2;
  DelimiterTable *pDVar3;
  vector<QuadTuple,_std::allocator<QuadTuple>_> *pvVar4;
  pointer pTVar5;
  int iVar6;
  int iVar7;
  mapped_type *pmVar8;
  long lVar9;
  ostream *poVar10;
  char *pcVar11;
  allocator local_2ac;
  allocator local_2ab;
  allocator local_2aa;
  allocator local_2a9;
  QuadTuple local_2a8;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[this->curIndex].type != KEYWORD) {
    return 0;
  }
  pKVar2 = this->keyWordTable;
  std::__cxx11::string::string((string *)&local_2a8,"if",&local_2ac);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&(pKVar2->
                         super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ).index,&local_2a8.op);
  iVar7 = *pmVar8;
  iVar6 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[this->curIndex].id;
  std::__cxx11::string::~string((string *)&local_2a8);
  if (iVar7 != iVar6) {
    return 0;
  }
  lVar9 = (long)this->curIndex + 1;
  this->curIndex = (int)lVar9;
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar9].type == DELIMTER) {
    pDVar3 = this->delimiterTable;
    std::__cxx11::string::string((string *)&local_2a8,"(",&local_2ac);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(pDVar3->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,&local_2a8.op);
    iVar7 = *pmVar8;
    iVar6 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
            super__Vector_impl_data._M_start[this->curIndex].id;
    std::__cxx11::string::~string((string *)&local_2a8);
    if (iVar7 != iVar6) goto LAB_0010a085;
    this->curIndex = this->curIndex + 1;
    pvVar4 = this->quadVec;
    std::__cxx11::string::string((string *)&local_40,"if",&local_2ac);
    std::__cxx11::string::string((string *)&local_60,"__",&local_2aa);
    std::__cxx11::string::string((string *)&local_80,"__",&local_2ab);
    std::__cxx11::string::string((string *)&local_a0,"__",&local_2a9);
    QuadTuple::QuadTuple(&local_2a8,&local_40,&local_60,&local_80,&local_a0);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>(pvVar4,&local_2a8);
    QuadTuple::~QuadTuple(&local_2a8);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    iVar6 = expression(this);
    iVar7 = this->curIndex;
    pTVar5 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar6 == 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,(string *)&pTVar5[iVar7].name);
      std::endl<char,std::char_traits<char>>(poVar10);
      pcVar11 = anon_var_dwarf_27f8c;
    }
    else {
      if (pTVar5[iVar7].type == DELIMTER) {
        pDVar3 = this->delimiterTable;
        std::__cxx11::string::string((string *)&local_2a8,")",&local_2ac);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&(pDVar3->
                               super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ).index,&local_2a8.op);
        iVar6 = *pmVar8;
        iVar1 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                super__Vector_impl_data._M_start[this->curIndex].id;
        std::__cxx11::string::~string((string *)&local_2a8);
        iVar7 = this->curIndex;
        if (iVar6 == iVar1) {
          this->curIndex = iVar7 + 1;
          pvVar4 = this->quadVec;
          std::__cxx11::string::string((string *)&local_c0,"ifbegin",&local_2ac);
          std::__cxx11::string::string((string *)&local_e0,(string *)&this->curTmpName);
          std::__cxx11::string::string((string *)&local_100,"__",&local_2aa);
          std::__cxx11::string::string((string *)&local_120,"__",&local_2ab);
          QuadTuple::QuadTuple(&local_2a8,&local_c0,&local_e0,&local_100,&local_120);
          std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>
                    (pvVar4,&local_2a8);
          QuadTuple::~QuadTuple(&local_2a8);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_c0);
          iVar7 = statement(this);
          if (iVar7 != 0) {
            if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                super__Vector_impl_data._M_start[this->curIndex].type != KEYWORD) {
LAB_00109f96:
              pvVar4 = this->quadVec;
              std::__cxx11::string::string((string *)&local_1c0,"ifend",&local_2ac);
              std::__cxx11::string::string((string *)&local_1e0,"__",&local_2aa);
              std::__cxx11::string::string((string *)&local_200,"__",&local_2ab);
              std::__cxx11::string::string((string *)&local_220,"__",&local_2a9);
              QuadTuple::QuadTuple(&local_2a8,&local_1c0,&local_1e0,&local_200,&local_220);
              std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>
                        (pvVar4,&local_2a8);
              QuadTuple::~QuadTuple(&local_2a8);
              std::__cxx11::string::~string((string *)&local_220);
              std::__cxx11::string::~string((string *)&local_200);
              std::__cxx11::string::~string((string *)&local_1e0);
              std::__cxx11::string::~string((string *)&local_1c0);
              return 1;
            }
            pKVar2 = this->keyWordTable;
            std::__cxx11::string::string((string *)&local_2a8,"else",&local_2ac);
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&(pKVar2->
                                   super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).index,&local_2a8.op);
            iVar7 = *pmVar8;
            iVar6 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                    super__Vector_impl_data._M_start[this->curIndex].id;
            std::__cxx11::string::~string((string *)&local_2a8);
            if (iVar7 != iVar6) goto LAB_00109f96;
            pvVar4 = this->quadVec;
            std::__cxx11::string::string((string *)&local_140,"else",&local_2ac);
            std::__cxx11::string::string((string *)&local_160,"__",&local_2aa);
            std::__cxx11::string::string((string *)&local_180,"__",&local_2ab);
            std::__cxx11::string::string((string *)&local_1a0,"__",&local_2a9);
            QuadTuple::QuadTuple(&local_2a8,&local_140,&local_160,&local_180,&local_1a0);
            std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>
                      (pvVar4,&local_2a8);
            QuadTuple::~QuadTuple(&local_2a8);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)&local_140);
            iVar7 = this->curIndex;
            this->curIndex = iVar7 + 1;
            iVar7 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                    super__Vector_impl_data._M_start[(long)iVar7 + 1].line;
            iVar6 = statement(this);
            if (iVar6 != 0) goto LAB_00109f96;
            poVar10 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_27fd6);
            goto LAB_0010a13d;
          }
          pcVar11 = anon_var_dwarf_27fb0;
          goto LAB_0010a11f;
        }
      }
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
      std::endl<char,std::char_traits<char>>(poVar10);
      poVar10 = std::operator<<((ostream *)&std::cout,
                                (string *)
                                &(this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)
                                 ._M_impl.super__Vector_impl_data._M_start[this->curIndex].name);
      std::endl<char,std::char_traits<char>>(poVar10);
      pcVar11 = anon_var_dwarf_27f98;
    }
  }
  else {
LAB_0010a085:
    pcVar11 = anon_var_dwarf_27f72;
  }
LAB_0010a11f:
  poVar10 = std::operator<<((ostream *)&std::cout,pcVar11);
  iVar7 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[this->curIndex].line;
LAB_0010a13d:
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
  poVar10 = std::operator<<(poVar10,anon_var_dwarf_27d3a);
  std::endl<char,std::char_traits<char>>(poVar10);
  exit(0);
}

Assistant:

int Parse::selectionStmt() {
    if (tokenVec[curIndex].type == KEYWORD && keyWordTable.index["if"] == tokenVec[curIndex].id) {
        curIndex++;
        int line = tokenVec[curIndex].line;
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["("] == tokenVec[curIndex].id) {
            curIndex++;
            quadVec.emplace_back(QuadTuple("if", "__", "__", "__"));
        } else {
            cout << "if语句缺少左括号在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        if(!expression()) {
            cout << tokenVec[curIndex].name << endl;
            cout << "if语句表达式错误在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[")"] == tokenVec[curIndex].id) {
            curIndex++;
        } else {
            cout << curIndex << endl;
            cout << tokenVec[curIndex].name  << endl;
            cout << "if语句缺少右括号在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        quadVec.emplace_back(QuadTuple("ifbegin", curTmpName, "__", "__"));
        //sem.pop();
        if(!statement()) {
            cout << "statement语句表达式错误在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        if (tokenVec[curIndex].type == KEYWORD && keyWordTable.index["else"] == tokenVec[curIndex].id) {
            quadVec.emplace_back(QuadTuple("else", "__", "__", "__"));
            curIndex++;
            int elseLine = tokenVec[curIndex].line;
            if(!statement()) {
                cout << "else 语句表达式错误在第"  << elseLine << "行" << endl;
                exit(0);
            }
        }
        quadVec.emplace_back(QuadTuple("ifend", "__", "__", "__"));
        return 1;
    }
    return 0;
}